

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

unsigned_long __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Inner::Get
          (Inner *this,unsigned_long defv,int level,uint k)

{
  Node *pNVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xc3,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pNVar1 = this->children[k >> ((char)level * '\x04' & 0x1fU) & 0xf];
  if (pNVar1 != (Node *)0x0) {
    iVar4 = (*pNVar1->_vptr_Node[2])(pNVar1,defv,(ulong)(level - 1),(ulong)k);
    return CONCAT44(extraout_var,iVar4);
  }
  return defv;
}

Assistant:

V Get(V defv, int level, uint k) const override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                    return defv;
                else
                    return children[i]->Get(defv, level, k);
            }